

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

bool __thiscall Jupiter::Socket::setBlocking(Socket *this,bool mode)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  
  bVar4 = false;
  uVar2 = fcntl(this->m_data->rawSock,3,0);
  if (-1 < (int)uVar2) {
    uVar1 = uVar2 | 0x800;
    if (mode) {
      uVar1 = uVar2 & 0x7ffff7ff;
    }
    iVar3 = fcntl(this->m_data->rawSock,4,(ulong)uVar1);
    bVar4 = iVar3 == 0;
  }
  return bVar4;
}

Assistant:

bool Jupiter::Socket::setBlocking(bool mode) {
#if defined _WIN32
	m_data->blockMode = !mode;
	return ioctlsocket(m_data->rawSock, FIONBIO, &m_data->blockMode) == 0;
#else // _WIN32
	int flags = fcntl(m_data->rawSock, F_GETFL, 0);
	if (flags < 0) return 0;
	if (mode) {
		flags &= ~O_NONBLOCK;
	}
	else {
		flags |= O_NONBLOCK;
	}
	return fcntl(m_data->rawSock, F_SETFL, flags) == 0;
#endif // _WIN32
}